

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O2

void __thiscall
iutest::detail::OptionalMatcher<iutest::detail::LtMatcher<int>_>::~OptionalMatcher
          (OptionalMatcher<iutest::detail::LtMatcher<int>_> *this)

{
  std::__cxx11::string::~string((string *)&this->m_whichIs);
  operator_delete(this,0x30);
  return;
}

Assistant:

class OptionalMatcher IUTEST_CXX_FINAL : public IMatcher
{
public:
    explicit OptionalMatcher(const T& expected)
        : m_expected(expected) {}

public:
    template<typename U>
    AssertionResult operator ()(const U& actual)
    {
        if( Check(actual) )
        {
            return AssertionSuccess();
        }
        return AssertionFailure() << WhichIs();
    }

private:
    template<typename U>
    bool Check(const U& actual)
    {
        bool result = true;
        Message ar;
        if( !actual )
        {
            result = false;
            ar << "which is not engaged";
        }
        else if( !CastToMatcher(m_expected)(*actual) )
        {
            result = false;
            ar << actual;
        }
        m_whichIs = ar.GetString();
        return result;
    }

public:
    ::std::string WhichIs() const IUTEST_CXX_OVERRIDE
    {
        iu_global_format_stringstream strm;
        strm << "Optional: " << PrintToString(m_expected);
        strm << " (" << m_whichIs << ")";
        return strm.str();
    }